

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

int lyht_find_first(hash_table *ht,uint32_t hash,ht_rec **rec_p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ht_rec *__dest;
  ht_rec *__src;
  ht_rec *phVar6;
  
  if (rec_p != (ht_rec **)0x0) {
    *rec_p = (ht_rec *)0x0;
  }
  uVar1 = ht->size - 1;
  uVar5 = hash & uVar1;
  __dest = (ht_rec *)0x0;
  uVar4 = uVar5;
  do {
    uVar3 = (ulong)(uVar4 * ht->rec_size);
    __src = (ht_rec *)(ht->recs + uVar3);
    iVar2 = *(int *)(ht->recs + uVar3 + 4);
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        if (rec_p == (ht_rec **)0x0) {
          return 1;
        }
        if (__dest == (ht_rec *)0x0) {
          __dest = __src;
        }
        iVar2 = 1;
        goto LAB_00110d5a;
      }
      if ((__src->hash & uVar1) == uVar5) {
        if (__dest != (ht_rec *)0x0) {
          memcpy(__dest,__src,(ulong)(uint)ht->rec_size);
          __src->hits = -1;
          __src = __dest;
        }
        iVar2 = 0;
        goto LAB_00110d55;
      }
    }
    phVar6 = __src;
    if (__dest != (ht_rec *)0x0) {
      phVar6 = __dest;
    }
    __src = __dest;
    if (iVar2 == -1) {
      __src = phVar6;
    }
    uVar4 = (uVar4 + 1) % ht->size;
    __dest = __src;
  } while (uVar4 != uVar5);
  if (__src == (ht_rec *)0x0) {
    __assert_fail("inval_rec",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                  ,0x1a3,"int lyht_find_first(struct hash_table *, uint32_t, struct ht_rec **)");
  }
  iVar2 = 1;
LAB_00110d55:
  __dest = __src;
  if (rec_p != (ht_rec **)0x0) {
LAB_00110d5a:
    *rec_p = __dest;
  }
  return iVar2;
}

Assistant:

static int
lyht_find_first(struct hash_table *ht, uint32_t hash, struct ht_rec **rec_p)
{
    struct ht_rec *rec, *inval_rec = NULL;
    uint32_t i, idx;

    if (rec_p) {
        *rec_p = NULL;
    }

    idx = i = hash & (ht->size - 1);
    rec = lyht_get_rec(ht->recs, ht->rec_size, idx);

    /* skip through overflow and deleted records */
    while ((rec->hits != 0) && ((rec->hits == -1) || ((rec->hash & (ht->size - 1)) != idx))) {
        if ((rec->hits == -1) && !inval_rec) {
            /* remember the first invalid record we found while searching for this hash */
            inval_rec = rec;
        }
        i = (i + 1) % ht->size;
        if (i == idx) {
            /* we went through all the records (very unlikely, but possible when many records are invalid),
             * just return not found */
            assert(inval_rec);
            if (rec_p) {
                *rec_p = inval_rec;
            }
            return 1;
        }
        rec = lyht_get_rec(ht->recs, ht->rec_size, i);
    }

    if (rec->hits == 0) {
        /* we could not find the value */
        if (rec_p) {
            /* return the first empty (or invalid) record found */
            *rec_p = inval_rec ? inval_rec : rec;
        }
        return 1;
    }

    /* we have found a record with equal (shortened) hash,
     * move it to the first invalid record so that the next search is faster */
    if (inval_rec) {
        memcpy(inval_rec, rec, ht->rec_size);
        rec->hits = -1;
        rec = inval_rec;
    }
    if (rec_p) {
        *rec_p = rec;
    }
    return 0;
}